

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O1

Known * __thiscall
Nonogram::get_board_vertical(Known *__return_storage_ptr__,Nonogram *this,uint x,Board *board)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<bool,_std::allocator<bool>_> set;
  vector<bool,_std::allocator<bool>_> value;
  allocator_type local_82;
  allocator_type local_81;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)this->m_y,(bool *)&local_58,&local_82);
  local_82 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->m_y,(bool *)&local_82,&local_81);
  iVar1 = this->m_y;
  if (0 < (long)iVar1) {
    lVar2 = *(long *)&(board->first).
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[x].
                      super__Bvector_base<std::allocator<bool>_>._M_impl;
    lVar3 = *(long *)&(board->second).
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[x].
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data;
    uVar4 = 0;
    do {
      uVar5 = 1L << ((byte)uVar4 & 0x3f);
      uVar6 = uVar4 >> 6;
      if ((*(ulong *)(lVar2 + uVar6 * 8) >> (uVar4 & 0x3f) & 1) == 0) {
        uVar7 = ~uVar5 & local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6];
      }
      else {
        uVar7 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar6] | uVar5;
      }
      local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar6] = uVar7;
      if ((*(ulong *)(lVar3 + uVar6 * 8) & uVar5) == 0) {
        uVar5 = ~uVar5 & local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6];
      }
      else {
        uVar5 = uVar5 | local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6];
      }
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar6] = uVar5;
      uVar4 = uVar4 + 1;
    } while ((long)iVar1 != uVar4);
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<bool,_std::allocator<bool>_>_&,_true>
            (__return_storage_ptr__,&local_80,&local_58);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_board_vertical(unsigned int x, const Board &board) const {
    vector<bool> set(m_y), value(m_y);

    for (int i = 0; i < m_y; i++) {
        set[i] = board.first[x][i];
        value[i] = board.second[x][i];
    }

    return {set, value};
}